

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

int64_t GetBlockProofEquivalentTime
                  (CBlockIndex *to,CBlockIndex *from,CBlockIndex *tip,Params *params)

{
  int iVar1;
  uint uVar2;
  base_uint<256U> *pbVar3;
  long lVar4;
  arith_uint256 *this;
  long lVar5;
  arith_uint256 *b;
  long in_FS_OFFSET;
  base_uint<256U> bStack_138;
  base_uint<256U> local_118;
  uint32_t local_f8 [2];
  uint32_t auStack_f0 [2];
  uint32_t local_e8 [2];
  uint32_t auStack_e0 [26];
  base_uint<256U> local_78;
  base_uint<256U> local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this = &to->nChainWork;
  b = &from->nChainWork;
  iVar1 = base_uint<256U>::CompareTo(&this->super_base_uint<256U>,&b->super_base_uint<256U>);
  if (iVar1 < 1) {
    local_58.pn._0_8_ = *(undefined8 *)(b->super_base_uint<256U>).pn;
    local_58.pn._8_8_ = *(undefined8 *)((from->nChainWork).super_base_uint<256U>.pn + 2);
    local_58.pn._16_8_ = *(undefined8 *)((from->nChainWork).super_base_uint<256U>.pn + 4);
    local_58.pn._24_8_ = *(undefined8 *)((from->nChainWork).super_base_uint<256U>.pn + 6);
    pbVar3 = base_uint<256U>::operator-=(&local_58,&this->super_base_uint<256U>);
    local_78.pn._0_8_ = *(undefined8 *)pbVar3->pn;
    local_78.pn._8_8_ = *(undefined8 *)(pbVar3->pn + 2);
    local_78.pn._16_8_ = *(undefined8 *)(pbVar3->pn + 4);
    local_78.pn._24_8_ = *(undefined8 *)(pbVar3->pn + 6);
    lVar5 = -1;
  }
  else {
    local_58.pn._0_8_ = *(undefined8 *)(this->super_base_uint<256U>).pn;
    local_58.pn._8_8_ = *(undefined8 *)((to->nChainWork).super_base_uint<256U>.pn + 2);
    local_58.pn._16_8_ = *(undefined8 *)((to->nChainWork).super_base_uint<256U>.pn + 4);
    local_58.pn._24_8_ = *(undefined8 *)((to->nChainWork).super_base_uint<256U>.pn + 6);
    pbVar3 = base_uint<256U>::operator-=(&local_58,&b->super_base_uint<256U>);
    local_78.pn._0_8_ = *(undefined8 *)pbVar3->pn;
    local_78.pn._8_8_ = *(undefined8 *)(pbVar3->pn + 2);
    local_78.pn._16_8_ = *(undefined8 *)(pbVar3->pn + 4);
    local_78.pn._24_8_ = *(undefined8 *)(pbVar3->pn + 6);
    lVar5 = 1;
  }
  local_118.pn[0] = (uint32_t)params->nPowTargetSpacing;
  local_118.pn[1] = (uint32_t)((ulong)params->nPowTargetSpacing >> 0x20);
  local_118.pn[2] = 0;
  local_118.pn[3] = 0;
  local_118.pn[4] = 0;
  local_118.pn[5] = 0;
  local_118.pn[6] = 0;
  local_118.pn[7] = 0;
  local_58.pn[4] = local_78.pn[4];
  local_58.pn[5] = local_78.pn[5];
  local_58.pn[6] = local_78.pn[6];
  local_58.pn[7] = local_78.pn[7];
  local_58.pn[0] = local_78.pn[0];
  local_58.pn[1] = local_78.pn[1];
  local_58.pn[2] = local_78.pn[2];
  local_58.pn[3] = local_78.pn[3];
  pbVar3 = base_uint<256U>::operator*=(&local_58,&local_118);
  local_f8 = *(uint32_t (*) [2])pbVar3->pn;
  auStack_f0 = *(uint32_t (*) [2])(pbVar3->pn + 2);
  local_e8 = *(uint32_t (*) [2])(pbVar3->pn + 4);
  auStack_e0._0_8_ = *(undefined8 *)(pbVar3->pn + 6);
  GetBlockProof((arith_uint256 *)&bStack_138,tip);
  local_58.pn[4] = local_e8[0];
  local_58.pn[5] = local_e8[1];
  local_58.pn[6] = auStack_e0[0];
  local_58.pn[7] = auStack_e0[1];
  local_58.pn[0] = local_f8[0];
  local_58.pn[1] = local_f8[1];
  local_58.pn[2] = auStack_f0[0];
  local_58.pn[3] = auStack_f0[1];
  pbVar3 = base_uint<256U>::operator/=(&local_58,&bStack_138);
  local_78.pn._0_8_ = *(undefined8 *)pbVar3->pn;
  local_78.pn._8_8_ = *(undefined8 *)(pbVar3->pn + 2);
  local_78.pn._16_8_ = *(undefined8 *)(pbVar3->pn + 4);
  local_78.pn._24_8_ = *(undefined8 *)(pbVar3->pn + 6);
  uVar2 = base_uint<256U>::bits(&local_78);
  lVar4 = local_78.pn._0_8_;
  if (0x3f < uVar2) {
    lVar4 = 0x7fffffffffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return lVar4 * lVar5;
}

Assistant:

int64_t GetBlockProofEquivalentTime(const CBlockIndex& to, const CBlockIndex& from, const CBlockIndex& tip, const Consensus::Params& params)
{
    arith_uint256 r;
    int sign = 1;
    if (to.nChainWork > from.nChainWork) {
        r = to.nChainWork - from.nChainWork;
    } else {
        r = from.nChainWork - to.nChainWork;
        sign = -1;
    }
    r = r * arith_uint256(params.nPowTargetSpacing) / GetBlockProof(tip);
    if (r.bits() > 63) {
        return sign * std::numeric_limits<int64_t>::max();
    }
    return sign * int64_t(r.GetLow64());
}